

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string_t *
el::base::utils::DateTime::formatTime_abi_cxx11_
          (unsigned_long_long time,TimestampUnit timestampUnit)

{
  ulong uVar1;
  ostream *poVar2;
  ulong uVar3;
  uint in_EDX;
  ulong in_RSI;
  string_t *in_RDI;
  undefined1 auVar4 [16];
  stringstream_t ss;
  EnumType i;
  char_t *unit;
  EnumType start;
  float local_1d4;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [380];
  uint local_24;
  char *local_20;
  ulong local_10;
  
  local_20 = *(char **)(consts::kTimeFormats + (ulong)in_EDX * 0x10 + 8);
  local_24 = in_EDX;
  for (local_10 = in_RSI;
      ((local_24 < 5 &&
       (auVar4._8_4_ = (int)(local_10 >> 0x20), auVar4._0_8_ = local_10, auVar4._12_4_ = 0x45300000,
       *(double *)(consts::kTimeFormats + (ulong)local_24 * 0x10) <
       (auVar4._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)local_10) - 4503599627370496.0))) &&
      ((*(double *)(consts::kTimeFormats + (ulong)local_24 * 0x10) != 1000.0 ||
       ((NAN(*(double *)(consts::kTimeFormats + (ulong)local_24 * 0x10)) ||
        (local_1d4 = (float)local_10, 1.9 <= local_1d4 / 1000.0))))));
      local_10 = local_10 /
                 (uVar3 | (long)(*(double *)(consts::kTimeFormats + uVar1 * 0x10) -
                                9.223372036854776e+18) & (long)uVar3 >> 0x3f)) {
    uVar1 = (ulong)local_24;
    uVar3 = (ulong)*(double *)(consts::kTimeFormats + uVar1 * 0x10);
    local_20 = *(char **)(consts::kTimeFormats + (ulong)(local_24 + 1) * 0x10 + 8);
    local_24 = local_24 + 1;
  }
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  poVar2 = (ostream *)::std::ostream::operator<<(local_1a0,local_10);
  poVar2 = ::std::operator<<(poVar2," ");
  ::std::operator<<(poVar2,local_20);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return in_RDI;
}

Assistant:

base::type::string_t DateTime::formatTime(unsigned long long time, base::TimestampUnit timestampUnit) {
  base::type::EnumType start = static_cast<base::type::EnumType>(timestampUnit);
  const base::type::char_t* unit = base::consts::kTimeFormats[start].unit;
  for (base::type::EnumType i = start; i < base::consts::kTimeFormatsCount - 1; ++i) {
    if (time <= base::consts::kTimeFormats[i].value) {
      break;
    }
    if (base::consts::kTimeFormats[i].value == 1000.0f && time / 1000.0f < 1.9f) {
      break;
    }
    time /= static_cast<decltype(time)>(base::consts::kTimeFormats[i].value);
    unit = base::consts::kTimeFormats[i + 1].unit;
  }
  base::type::stringstream_t ss;
  ss << time << " " << unit;
  return ss.str();
}